

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

void av1_count_colors(uint8_t *src,int stride,int rows,int cols,int *val_count,int *num_colors)

{
  int i;
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = 0;
  memset(val_count,0,0x400);
  uVar6 = (ulong)(uint)cols;
  if (cols < 1) {
    uVar6 = uVar4;
  }
  uVar5 = (ulong)(uint)rows;
  if (rows < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      val_count[src[uVar3]] = val_count[src[uVar3]] + 1;
    }
    src = src + stride;
  }
  iVar2 = 0;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    iVar2 = (iVar2 + 1) - (uint)(val_count[lVar1] == 0);
  }
  *num_colors = iVar2;
  return;
}

Assistant:

void av1_count_colors(const uint8_t *src, int stride, int rows, int cols,
                      int *val_count, int *num_colors) {
  const int max_pix_val = 1 << 8;
  memset(val_count, 0, max_pix_val * sizeof(val_count[0]));
  for (int r = 0; r < rows; ++r) {
    for (int c = 0; c < cols; ++c) {
      const int this_val = src[r * stride + c];
      assert(this_val < max_pix_val);
      ++val_count[this_val];
    }
  }
  int n = 0;
  for (int i = 0; i < max_pix_val; ++i) {
    if (val_count[i]) ++n;
  }
  *num_colors = n;
}